

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,decimal_fp<float> *fp,
          basic_format_specs<char8_t> *specs,float_specs fspecs,locale_ref loc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  size_t sVar15;
  char8_t decimal_point;
  char8_t zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  digit_grouping<char8_t> grouping;
  anon_class_28_8_ad0ecca5 write;
  undefined1 local_e2 [30];
  undefined1 local_c4 [8];
  undefined4 uStack_bc;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0;
  basic_format_specs<char8_t> *local_98;
  long local_90;
  decimal_fp<float> *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [12];
  char cStack_6c;
  undefined3 uStack_6b;
  int local_68;
  char8_t cStack_64;
  undefined2 uStack_62;
  decimal_fp<float> *local_60;
  digit_grouping<char8_t> *local_58;
  digit_grouping<char8_t> *local_50;
  int *local_48;
  int *local_40;
  char8_t *local_38;
  
  uVar1 = fp->significand;
  uVar3 = 0x1f;
  if ((uVar1 | 1) != 0) {
    for (; (uVar1 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar8 = (ulong)uVar1 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar3 * 8);
  uVar14 = uVar8 >> 0x20;
  iVar6 = (int)(uVar8 >> 0x20);
  local_e2[1] = 0x30;
  uVar3 = fspecs._4_4_;
  local_e2._10_4_ = uVar3 >> 8 & 0xff;
  local_e2._6_4_ = iVar6;
  local_e2._14_4_ = uVar1;
  local_80 = (undefined1  [8])fspecs;
  if ((long)uVar8 < 0) {
LAB_0018098f:
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  }
  lVar12 = (uVar14 + 1) - (ulong)(local_e2._10_4_ == 0);
  local_e2[0] = '.';
  if ((uVar3 >> 0x11 & 1) != 0) {
    local_e2._18_8_ = out.container;
    local_98 = specs;
    local_90 = lVar12;
    local_88 = fp;
    local_e2[0] = fmt::v8::detail::decimal_point_impl<char>(loc);
    specs = local_98;
    out.container = (buffer<char8_t> *)local_e2._18_8_;
    fp = local_88;
    lVar12 = local_90;
  }
  uVar2 = fp->exponent;
  local_c4._0_4_ = uVar2 + iVar6;
  iVar13 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_001806cc:
    iVar7 = uVar2 + iVar6 + -1;
    if ((uVar3 >> 0x14 & 1) == 0) {
      uVar8 = 0;
      if (iVar6 == 1) {
        local_e2[0] = '\0';
        uVar8 = 0;
      }
    }
    else {
      uVar8 = 0;
      if (0 < iVar13 - iVar6) {
        uVar8 = (ulong)(uint)(iVar13 - iVar6);
      }
      lVar12 = lVar12 + uVar8;
    }
    local_78._0_8_ = CONCAT44(uVar1,uVar3 >> 8) & 0xffffffff000000ff;
    cStack_6c = local_e2[0];
    local_78._8_4_ = iVar6;
    _local_68 = CONCAT14('0',(int)uVar8);
    _local_68 = CONCAT26(uStack_62,CONCAT15(((uVar3 >> 0x10 & 1) == 0) << 5,_local_68)) |
                0x450000000000;
    local_60 = (decimal_fp<float> *)CONCAT44(local_60._4_4_,iVar7);
    if (0 < specs->width) {
      if ((int)local_c4._0_4_ < 1) {
        iVar7 = 1 - local_c4._0_4_;
      }
      lVar4 = 2;
      if (99 < iVar7) {
        lVar4 = (ulong)(999 < iVar7) + 3;
      }
      sVar15 = lVar12 + (3 - (ulong)(local_e2[0] == '\0')) + lVar4;
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,sVar15,sVar15,(anon_class_28_8_ad0ecca5 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    bVar5 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char8_t,_fmt::v8::detail::digit_grouping<char8_t>_>
            ::anon_class_28_8_ad0ecca5::operator()
                      ((anon_class_28_8_ad0ecca5 *)local_78,out.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar7 = 0x10;
    if (0 < iVar13) {
      iVar7 = iVar13;
    }
    if (((int)local_c4._0_4_ < -3) || (iVar7 < (int)local_c4._0_4_)) goto LAB_001806cc;
  }
  if ((int)uVar2 < 0) {
    if ((int)local_c4._0_4_ < 1) {
      iVar6 = -local_c4._0_4_;
      local_c4._4_4_ = iVar6;
      if (SBORROW4(iVar13,iVar6) != iVar13 + local_c4._0_4_ < 0) {
        local_c4._4_4_ = iVar13;
      }
      if (iVar13 < 0) {
        local_c4._4_4_ = iVar6;
      }
      if (uVar14 != 0) {
        local_c4._4_4_ = iVar6;
      }
      if (local_c4._4_4_ == 0 && uVar14 == 0) {
        local_e2[2] = (char)((uVar3 & 0x100000) >> 0x14);
        iVar6 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_e2[2] = 1;
        iVar6 = 2;
        if ((int)local_c4._4_4_ < 0) goto LAB_0018098f;
      }
      sVar15 = lVar12 + (ulong)(uint)(iVar6 + local_c4._4_4_);
      local_78._0_8_ = local_e2 + 10;
      unique0x00004e80 = local_e2 + 1;
      _local_68 = local_e2 + 2;
      local_60 = (decimal_fp<float> *)local_e2;
      local_58 = (digit_grouping<char8_t> *)(local_c4 + 4);
      local_50 = (digit_grouping<char8_t> *)(local_e2 + 0xe);
      local_48 = (int *)(local_e2 + 6);
      bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_&>
                        (out,specs,sVar15,sVar15,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
    }
    iVar7 = 0;
    local_e2._2_4_ = iVar13 - iVar6 & (int)(uVar3 << 0xb) >> 0x1f;
    uVar1 = local_e2._2_4_;
    if ((int)local_e2._2_4_ < 1) {
      uVar1 = 0;
    }
    local_e2._18_8_ = out.container;
    digit_grouping<char8_t>::digit_grouping
              ((digit_grouping<char8_t> *)(local_c4 + 4),loc,(bool)((byte)(uVar3 >> 0x11) & 1));
    if (local_a0 != '\0') {
      pcVar10 = (char *)CONCAT44(uStack_bc,local_c4._4_4_);
      pcVar11 = pcVar10 + local_b8;
      lVar4 = 0;
      do {
        if (pcVar10 == pcVar11) {
          cVar9 = pcVar11[-1];
          pcVar10 = pcVar11;
        }
        else {
          cVar9 = *pcVar10;
          if ((byte)(cVar9 + 0x81U) < 0x82) goto LAB_001809a9;
          pcVar10 = pcVar10 + 1;
        }
        iVar7 = iVar7 + cVar9;
        if ((int)local_e2._6_4_ <= iVar7) goto LAB_001809a9;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    lVar4 = 0;
LAB_001809a9:
    sVar15 = lVar12 + (ulong)uVar1 + 1 + lVar4;
    local_78._0_8_ = local_e2 + 10;
    unique0x00004e80 = local_e2 + 0xe;
    _local_68 = local_e2 + 6;
    local_60 = (decimal_fp<float> *)local_c4;
    local_58 = (digit_grouping<char8_t> *)local_e2;
    local_48 = (int *)(local_e2 + 2);
    local_40 = (int *)(local_e2 + 1);
    local_50 = (digit_grouping<char8_t> *)(local_c4 + 4);
    bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_&>
                      ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)local_e2._18_8_,
                       specs,sVar15,sVar15,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_00180a06;
  }
  lVar12 = lVar12 + (ulong)uVar2;
  local_e2._2_4_ = iVar13 - local_c4._0_4_;
  if ((uVar3 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e2._2_4_) {
      if ((int)local_e2._2_4_ < 1) goto LAB_00180882;
    }
    else {
      local_e2._2_4_ = 1;
    }
    lVar12 = lVar12 + (ulong)(uint)local_e2._2_4_ + 1;
  }
LAB_00180882:
  digit_grouping<char8_t>::digit_grouping
            ((digit_grouping<char8_t> *)(local_c4 + 4),loc,(bool)((byte)(uVar3 >> 0x11) & 1));
  iVar6 = 0;
  if (local_a0 != '\0') {
    pcVar10 = (char *)CONCAT44(uStack_bc,local_c4._4_4_);
    pcVar11 = pcVar10 + local_b8;
    lVar4 = 0;
    do {
      if (pcVar10 == pcVar11) {
        cVar9 = pcVar11[-1];
        pcVar10 = pcVar11;
      }
      else {
        cVar9 = *pcVar10;
        if ((byte)(cVar9 + 0x81U) < 0x82) goto LAB_001808ef;
        pcVar10 = pcVar10 + 1;
      }
      iVar6 = iVar6 + cVar9;
      if ((int)local_e2._6_4_ <= iVar6) goto LAB_001808ef;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  lVar4 = 0;
LAB_001808ef:
  local_78._0_8_ = local_e2 + 10;
  unique0x00004e80 = local_e2 + 0xe;
  _local_68 = local_e2 + 6;
  local_50 = (digit_grouping<char8_t> *)local_80;
  local_48 = (int *)local_e2;
  local_40 = (int *)(local_e2 + 2);
  local_38 = local_e2 + 1;
  local_60 = fp;
  local_58 = (digit_grouping<char8_t> *)(local_c4 + 4);
  bVar5 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_&>
                    (out,specs,lVar12 + lVar4,lVar12 + lVar4,(anon_class_72_9_d68ba176 *)local_78);
LAB_00180a06:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_bc,local_c4._4_4_) != &local_b0) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_bc,local_c4._4_4_),local_b0._M_allocated_capacity + 1);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}